

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void __thiscall helics::FedObject::~FedObject(FedObject *this)

{
  __shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  MessageHolder::clear(&this->messages);
  std::
  vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
  ::clear(&this->inputs);
  std::
  vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
  ::clear(&this->pubs);
  std::
  vector<std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>,_std::allocator<std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>_>_>
  ::clear(&this->epts);
  std::
  vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
  ::clear(&this->filters);
  local_48._M_ptr = (element_type *)0x0;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>,
             &local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&this->commandBuffer);
  std::
  vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
  ::~vector(&this->translators);
  std::
  vector<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
  ::~vector(&this->filters);
  std::
  vector<std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>,_std::allocator<std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>_>_>
  ::~vector(&this->epts);
  std::
  vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
  ::~vector(&this->pubs);
  std::
  vector<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>,_std::allocator<std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>_>_>
  ::~vector(&this->inputs);
  MessageHolder::~MessageHolder(&this->messages);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

helics::FedObject::~FedObject()
{
    // we want to remove the values in the arrays before deleting the fedptr
    // and we want to do it inside this function to ensure it does so in a consistent manner
    messages.clear();
    inputs.clear();
    pubs.clear();
    epts.clear();
    filters.clear();
    fedptr = nullptr;
}